

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license_verifier.cpp
# Opt level: O0

FUNCTION_RETURN __thiscall
license::LicenseVerifier::verify_signature(LicenseVerifier *this,FullLicenseInfo *licInfo)

{
  FUNCTION_RETURN FVar1;
  undefined1 local_38 [4];
  FUNCTION_RETURN ret;
  string licInfoData;
  FullLicenseInfo *licInfo_local;
  LicenseVerifier *this_local;
  
  licInfoData.field_2._8_8_ = licInfo;
  FullLicenseInfo::printForSign_abi_cxx11_((string *)local_38,licInfo);
  FVar1 = os::verify_signature((string *)local_38,(string *)licInfoData.field_2._8_8_);
  if (FVar1 == FUNC_RET_OK) {
    EventRegistry::addEvent
              (this->m_event_registry,SIGNATURE_VERIFIED,
               (string *)(licInfoData.field_2._8_8_ + 0x20));
  }
  else {
    EventRegistry::addEvent
              (this->m_event_registry,IFF_LOOPBACK,(string *)(licInfoData.field_2._8_8_ + 0x20));
  }
  std::__cxx11::string::~string((string *)local_38);
  return FVar1;
}

Assistant:

FUNCTION_RETURN LicenseVerifier::verify_signature(const FullLicenseInfo& licInfo) {
	const string licInfoData(licInfo.printForSign());

	FUNCTION_RETURN ret = license::os::verify_signature(licInfoData, licInfo.license_signature);

	if (ret == FUNC_RET_OK) {
		m_event_registry.addEvent(SIGNATURE_VERIFIED, licInfo.source);
	} else {
		m_event_registry.addEvent(LICENSE_CORRUPTED, licInfo.source);
	}
	return ret;
}